

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DebugInfoManager::ClearDebugInfo(DebugInfoManager *this,Instruction *instr)

{
  uint uVar1;
  ulong uVar2;
  _Head_base<0UL,_spvtools::opt::Module_*,_false> _Var3;
  CommonDebugInfoInstructions CVar4;
  OpenCLDebugInfo100Instructions OVar5;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar6;
  uint32_t uVar7;
  __hash_code __code;
  ulong uVar8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  Instruction *pIVar12;
  pair<std::_Rb_tree_iterator<spvtools::opt::Instruction_*>,_std::_Rb_tree_iterator<spvtools::opt::Instruction_*>_>
  pVar13;
  uint32_t fn_id;
  Instruction *local_28;
  uint32_t local_1c;
  
  uVar1 = (instr->dbg_scope_).lexical_scope_;
  uVar2 = (this->scope_id_to_users_)._M_h._M_bucket_count;
  uVar8 = (ulong)uVar1 % uVar2;
  p_Var10 = (this->scope_id_to_users_)._M_h._M_buckets[uVar8];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var10->_M_nxt, p_Var11 = p_Var10, uVar1 != *(uint *)&p_Var10->_M_nxt[1]._M_nxt)) {
    while (p_Var10 = p_Var9, p_Var9 = p_Var10->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar2 != uVar8) ||
         (p_Var11 = p_Var10, uVar1 == *(uint *)&p_Var9[1]._M_nxt)) goto LAB_00560e82;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00560e82:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var11->_M_nxt;
  }
  local_28 = instr;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(p_Var9 + 2),&local_28);
  }
  uVar1 = (local_28->dbg_scope_).inlined_at_;
  uVar2 = (this->inlinedat_id_to_users_)._M_h._M_bucket_count;
  uVar8 = (ulong)uVar1 % uVar2;
  p_Var10 = (this->inlinedat_id_to_users_)._M_h._M_buckets[uVar8];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var10->_M_nxt, p_Var11 = p_Var10, uVar1 != *(uint *)&p_Var10->_M_nxt[1]._M_nxt)) {
    while (p_Var10 = p_Var9, p_Var9 = p_Var10->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar2 != uVar8) ||
         (p_Var11 = p_Var10, uVar1 == *(uint *)&p_Var9[1]._M_nxt)) goto LAB_00560f05;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_00560f05:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var11->_M_nxt;
  }
  if (p_Var9 != (_Hash_node_base *)0x0) {
    std::
    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(p_Var9 + 2),&local_28);
  }
  if ((local_28 != (Instruction *)0x0) &&
     (CVar4 = Instruction::GetCommonDebugOpcode(local_28), CVar4 != CommonDebugInfoInstructionsMax))
  {
    local_1c = 0;
    if (local_28->has_result_id_ == true) {
      local_1c = Instruction::GetSingleWordOperand(local_28,(uint)local_28->has_type_id_);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->id_to_dbg_inst_)._M_h);
    OVar5 = Instruction::GetOpenCL100DebugOpcode(local_28);
    if (OVar5 == OpenCLDebugInfo100DebugFunction) {
      local_1c = Instruction::GetSingleWordOperand(local_28,0xd);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->fn_id_to_dbg_fn_)._M_h);
    }
    NVar6 = Instruction::GetShader100DebugOpcode(local_28);
    if (NVar6 == NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
      local_1c = Instruction::GetSingleWordOperand(local_28,5);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->fn_id_to_dbg_fn_)._M_h);
    }
    CVar4 = Instruction::GetCommonDebugOpcode(local_28);
    if ((CVar4 == CommonDebugInfoDebugDeclare) ||
       (CVar4 = Instruction::GetCommonDebugOpcode(local_28), CVar4 == CommonDebugInfoDebugValue)) {
      uVar7 = Instruction::GetSingleWordOperand(local_28,5);
      uVar2 = (this->var_id_to_dbg_decl_)._M_h._M_bucket_count;
      uVar8 = (ulong)uVar7 % uVar2;
      p_Var10 = (this->var_id_to_dbg_decl_)._M_h._M_buckets[uVar8];
      p_Var11 = (__node_base_ptr)0x0;
      if ((p_Var10 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var10->_M_nxt, p_Var11 = p_Var10,
         uVar7 != *(uint32_t *)&p_Var10->_M_nxt[1]._M_nxt)) {
        while (p_Var10 = p_Var9, p_Var9 = p_Var10->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
          p_Var11 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar2 != uVar8) ||
             (p_Var11 = p_Var10, uVar7 == *(uint *)&p_Var9[1]._M_nxt)) goto LAB_0056104a;
        }
        p_Var11 = (__node_base_ptr)0x0;
      }
LAB_0056104a:
      if (p_Var11 == (__node_base_ptr)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var9 = p_Var11->_M_nxt;
      }
      if (p_Var9 != (_Hash_node_base *)0x0) {
        pVar13 = std::
                 _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::equal_range((_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                                *)(p_Var9 + 2),&local_28);
        std::
        _Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
        ::_M_erase_aux((_Rb_tree<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::_Identity<spvtools::opt::Instruction_*>,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)(p_Var9 + 2),(_Base_ptr)pVar13.first._M_node,
                       (_Base_ptr)pVar13.second._M_node);
      }
    }
    if (this->deref_operation_ == local_28) {
      this->deref_operation_ = (Instruction *)0x0;
      _Var3._M_head_impl =
           (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      pIVar12 = *(Instruction **)((long)&(_Var3._M_head_impl)->ext_inst_debuginfo_ + 0x10);
      if (pIVar12 != (Instruction *)((long)&(_Var3._M_head_impl)->ext_inst_debuginfo_ + 8U)) {
        do {
          if ((((local_28 != pIVar12) &&
               (OVar5 = Instruction::GetOpenCL100DebugOpcode(pIVar12),
               OVar5 == OpenCLDebugInfo100DebugOperation)) &&
              (uVar7 = Instruction::GetSingleWordOperand(pIVar12,4), uVar7 == 0)) ||
             (((local_28 != pIVar12 &&
               (NVar6 = Instruction::GetShader100DebugOpcode(pIVar12),
               NVar6 == NonSemanticShaderDebugInfo100DebugOperation)) &&
              (uVar7 = GetVulkanDebugOperation(this,pIVar12), uVar7 == 0)))) {
            this->deref_operation_ = pIVar12;
            break;
          }
          pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar12 !=
                 (Instruction *)
                 ((long)&((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                         ext_inst_debuginfo_ + 8U));
      }
    }
    if (this->debug_info_none_inst_ == local_28) {
      this->debug_info_none_inst_ = (Instruction *)0x0;
      _Var3._M_head_impl =
           (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      pIVar12 = *(Instruction **)((long)&(_Var3._M_head_impl)->ext_inst_debuginfo_ + 0x10);
      if (pIVar12 != (Instruction *)((long)&(_Var3._M_head_impl)->ext_inst_debuginfo_ + 8U)) {
        do {
          if ((local_28 != pIVar12) &&
             (CVar4 = Instruction::GetCommonDebugOpcode(pIVar12),
             CVar4 == CommonDebugInfoDebugInfoNone)) {
            this->debug_info_none_inst_ = pIVar12;
            break;
          }
          pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar12 !=
                 (Instruction *)
                 ((long)&((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                         ext_inst_debuginfo_ + 8U));
      }
    }
    if (this->empty_debug_expr_inst_ == local_28) {
      this->empty_debug_expr_inst_ = (Instruction *)0x0;
      _Var3._M_head_impl =
           (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      pIVar12 = *(Instruction **)((long)&(_Var3._M_head_impl)->ext_inst_debuginfo_ + 0x10);
      if (pIVar12 != (Instruction *)((long)&(_Var3._M_head_impl)->ext_inst_debuginfo_ + 8U)) {
        do {
          if (((local_28 != pIVar12) &&
              (CVar4 = Instruction::GetCommonDebugOpcode(pIVar12),
              CVar4 == CommonDebugInfoDebugExpression)) &&
             ((int)((ulong)((long)(pIVar12->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pIVar12->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 == 4
             )) {
            this->empty_debug_expr_inst_ = pIVar12;
            return;
          }
          pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar12 !=
                 (Instruction *)
                 ((long)&((this->context_->module_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                          .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                         ext_inst_debuginfo_ + 8U));
      }
    }
  }
  return;
}

Assistant:

void DebugInfoManager::ClearDebugInfo(Instruction* instr) {
  auto scope_id_to_users_itr =
      scope_id_to_users_.find(instr->GetDebugScope().GetLexicalScope());
  if (scope_id_to_users_itr != scope_id_to_users_.end()) {
    scope_id_to_users_itr->second.erase(instr);
  }
  auto inlinedat_id_to_users_itr =
      inlinedat_id_to_users_.find(instr->GetDebugInlinedAt());
  if (inlinedat_id_to_users_itr != inlinedat_id_to_users_.end()) {
    inlinedat_id_to_users_itr->second.erase(instr);
  }

  if (instr == nullptr || !instr->IsCommonDebugInstr()) {
    return;
  }

  id_to_dbg_inst_.erase(instr->result_id());

  if (instr->GetOpenCL100DebugOpcode() == OpenCLDebugInfo100DebugFunction) {
    auto fn_id =
        instr->GetSingleWordOperand(kDebugFunctionOperandFunctionIndex);
    fn_id_to_dbg_fn_.erase(fn_id);
  }
  if (instr->GetShader100DebugOpcode() ==
      NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
    auto fn_id = instr->GetSingleWordOperand(
        kDebugFunctionDefinitionOperandOpFunctionIndex);
    fn_id_to_dbg_fn_.erase(fn_id);
  }

  if (instr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
      instr->GetCommonDebugOpcode() == CommonDebugInfoDebugValue) {
    auto var_or_value_id =
        instr->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
    auto dbg_decl_itr = var_id_to_dbg_decl_.find(var_or_value_id);
    if (dbg_decl_itr != var_id_to_dbg_decl_.end()) {
      dbg_decl_itr->second.erase(instr);
    }
  }

  if (deref_operation_ == instr) {
    deref_operation_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      // OpenCL.DebugInfo.100 contains the operation as a literal operand, in
      // Vulkan it's referenced as an OpConstant.
      if (instr != &*dbg_instr_itr &&
          dbg_instr_itr->GetOpenCL100DebugOpcode() ==
              OpenCLDebugInfo100DebugOperation &&
          dbg_instr_itr->GetSingleWordOperand(
              kDebugOperationOperandOperationIndex) ==
              OpenCLDebugInfo100Deref) {
        deref_operation_ = &*dbg_instr_itr;
        break;
      } else if (instr != &*dbg_instr_itr &&
                 dbg_instr_itr->GetShader100DebugOpcode() ==
                     NonSemanticShaderDebugInfo100DebugOperation) {
        uint32_t operation_const = GetVulkanDebugOperation(&*dbg_instr_itr);
        if (operation_const == NonSemanticShaderDebugInfo100Deref) {
          deref_operation_ = &*dbg_instr_itr;
          break;
        }
      }
    }
  }

  if (debug_info_none_inst_ == instr) {
    debug_info_none_inst_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      if (instr != &*dbg_instr_itr && dbg_instr_itr->GetCommonDebugOpcode() ==
                                          CommonDebugInfoDebugInfoNone) {
        debug_info_none_inst_ = &*dbg_instr_itr;
        break;
      }
    }
  }

  if (empty_debug_expr_inst_ == instr) {
    empty_debug_expr_inst_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      if (instr != &*dbg_instr_itr && IsEmptyDebugExpression(&*dbg_instr_itr)) {
        empty_debug_expr_inst_ = &*dbg_instr_itr;
        break;
      }
    }
  }
}